

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap-profile-table.cc
# Opt level: O2

void __thiscall HeapProfileTable::MarkAsIgnored(HeapProfileTable *this,void *ptr)

{
  AllocValue *pAVar1;
  
  pAVar1 = AddressMap<HeapProfileTable::AllocValue>::FindMutable(this->address_map_,ptr);
  if (pAVar1 != (AllocValue *)0x0) {
    *(byte *)&pAVar1->bucket_rep = (byte)pAVar1->bucket_rep | 2;
  }
  return;
}

Assistant:

void HeapProfileTable::MarkAsIgnored(const void* ptr) {
  AllocValue* alloc = address_map_->FindMutable(ptr);
  if (alloc) {
    alloc->set_ignore(true);
  }
}